

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_opldumper_mididevice.cpp
# Opt level: O2

void __thiscall OPL_RDOSdump::OPL_RDOSdump(OPL_RDOSdump *this,FILE *file)

{
  (this->super_OPLDump).File = file;
  (this->super_OPLDump).TimePerTick = 0.0;
  (this->super_OPLDump).CurTime = 0.0;
  (this->super_OPLDump).CurIntTime = 0;
  (this->super_OPLDump).TickMul = 1;
  (this->super_OPLDump).CurChip = '\0';
  (this->super_OPLDump).super_OPLEmul._vptr_OPLEmul = (_func_int **)&PTR__OPL_RDOSdump_006e9af0;
  if (file != (FILE *)0x0) {
    fwrite("RAWADATA",1,10,(FILE *)file);
    (this->super_OPLDump).field_0x29 = 1;
    return;
  }
  __assert_fail("File != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/oplsynth/music_opldumper_mididevice.cpp"
                ,0x60,"OPL_RDOSdump::OPL_RDOSdump(FILE *)");
}

Assistant:

OPLDump(FILE *file) : File(file), TimePerTick(0), CurTime(0),
		CurIntTime(0), TickMul(1), CurChip(0) {}